

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
threadpool::partition
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          threadpool *this,uint64_t n)

{
  int iVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  allocator_type local_21;
  
  uVar5 = (ulong)this->num_threads;
  uVar3 = n % uVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,uVar5 + 1,&local_21);
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar2 = 0;
  iVar1 = this->num_threads;
  for (lVar4 = 1; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
    bVar6 = uVar3 == 0;
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar7) {
      uVar3 = 0;
    }
    puVar2[lVar4] = ((n / uVar5 + 1) - (ulong)bVar6) + puVar2[lVar4 + -1];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< uint64_t > partition(uint64_t n) {
        uint64_t quotient = n / num_threads;
        uint64_t remainder = n % num_threads;

        std::vector< uint64_t > blocks(num_threads + 1);
        blocks[0] = 0;
        for (int i = 1; i < num_threads + 1; i++) {
            if (remainder > 0) {
                blocks[i] = blocks[i-1] + quotient + 1;
                remainder--;
            } else {
                blocks[i] = blocks[i-1] + quotient;
            }
        }
        return blocks;
    }